

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O2

int __thiscall QColorDialogPrivate::init(QColorDialogPrivate *this,EVP_PKEY_CTX *ctx)

{
  QWidget *this_00;
  QPlatformDialogHelper *pQVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  QDialog::setSizeGripEnabled((QDialog *)this_00,false);
  QColorDialog::tr((QString *)&local_40,"Select Color",(char *)0x0,-1);
  QWidget::setWindowTitle(this_00,(QString *)&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  pQVar1 = QDialogPrivate::platformHelper(&this->super_QDialogPrivate);
  this->colorPickingEventFilter = (QColorPickingEventFilter *)0x0;
  this->nextCust = 0;
  (this->super_QDialogPrivate).nativeDialogInUse = pQVar1 != (QPlatformDialogHelper *)0x0;
  if (pQVar1 == (QPlatformDialogHelper *)0x0) {
    initWidgets(this);
  }
  QColorDialog::setCurrentColor((QColorDialog *)this_00,(QColor *)ctx);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QColorDialogPrivate::init(const QColor &initial)
{
    Q_Q(QColorDialog);

    q->setSizeGripEnabled(false);
    q->setWindowTitle(QColorDialog::tr("Select Color"));

    // default: use the native dialog if possible.  Can be overridden in setOptions()
    nativeDialogInUse = (platformColorDialogHelper() != nullptr);
    colorPickingEventFilter = nullptr;
    nextCust = 0;

    if (!nativeDialogInUse)
        initWidgets();

#ifdef Q_OS_WIN32
    dummyTransparentWindow.resize(1, 1);
    dummyTransparentWindow.setFlags(Qt::Tool | Qt::FramelessWindowHint);
#endif

    q->setCurrentColor(initial);
}